

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O1

int read_hex(char *str,unsigned_long *val)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 0;
  lVar2 = 0;
  do {
    bVar1 = str[lVar2];
    if ((byte)(bVar1 - 0x30) < 10) {
      uVar3 = uVar3 << 4 | (ulong)(byte)(bVar1 - 0x30);
    }
    else {
      if ((5 < (byte)(bVar1 + 0x9f)) && (5 < (byte)(bVar1 + 0xbf))) {
        *val = uVar3;
        return (int)lVar2;
      }
      uVar3 = uVar3 * 0x10 + (ulong)(bVar1 + 9 & 0x1f);
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static int read_hex(char *str, unsigned long *val) {
  unsigned long local_val = 0, len = 0;
  for (;;) {
    if (*str >= '0' && *str <= '9') {
      local_val = (local_val * 16) + (*str - '0');
      len++;
    } else if (*str >= 'a' && *str <= 'f') {
      local_val = (local_val * 16) + (*str - 'a' + 10);
      len++;
    } else if (*str >= 'A' && *str <= 'F') {
      local_val = (local_val * 16) + (*str - 'A' + 10);
      len++;
    } else {
      *val = local_val;
      return len;
    }
    str++;
  }
}